

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_socket_manager.cpp
# Opt level: O3

utp_socket_impl * __thiscall
libtorrent::aux::utp_socket_manager::new_utp_socket(utp_socket_manager *this,utp_stream *str)

{
  int iVar1;
  long lVar2;
  _Head_base<0UL,_libtorrent::aux::utp_socket_impl_*,_false> this_00;
  uint16_t recv_id;
  __single_object impl;
  uint16_t local_32;
  __uniq_ptr_impl<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
  local_30;
  
  iVar1 = this->m_new_connection;
  if (iVar1 == -1) {
    lVar2 = random((aux *)0xffff);
    iVar1 = (int)lVar2;
    recv_id = (short)lVar2 - 1;
  }
  else {
    recv_id = (short)iVar1 + 1;
    this->m_new_connection = -1;
  }
  local_32 = recv_id;
  this_00._M_head_impl = (utp_socket_impl *)operator_new(0x220);
  utp_socket_impl::utp_socket_impl(this_00._M_head_impl,recv_id,(uint16_t)iVar1,str,this);
  local_30._M_t.
  super__Tuple_impl<0UL,_libtorrent::aux::utp_socket_impl_*,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
  .super__Head_base<0UL,_libtorrent::aux::utp_socket_impl_*,_false>._M_head_impl =
       (tuple<libtorrent::aux::utp_socket_impl_*,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
        )(tuple<libtorrent::aux::utp_socket_impl_*,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
          )this_00._M_head_impl;
  ::std::
  _Rb_tree<unsigned_short,std::pair<unsigned_short_const,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>>,std::_Select1st<std::pair<unsigned_short_const,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>>>>
  ::
  _M_emplace_equal<unsigned_short&,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>>
            ((_Rb_tree<unsigned_short,std::pair<unsigned_short_const,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>>,std::_Select1st<std::pair<unsigned_short_const,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>>>>
              *)&this->m_utp_sockets,&local_32,
             (unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
              *)&local_30);
  ::std::
  unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
  ::~unique_ptr((unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
                 *)&local_30);
  return (_Head_base<0UL,_libtorrent::aux::utp_socket_impl_*,_false>)this_00._M_head_impl;
}

Assistant:

utp_socket_impl* utp_socket_manager::new_utp_socket(utp_stream* str)
	{
		std::uint16_t send_id = 0;
		std::uint16_t recv_id = 0;
		if (m_new_connection != -1)
		{
			send_id = std::uint16_t(m_new_connection);
			recv_id = std::uint16_t(m_new_connection + 1);
			m_new_connection = -1;
		}
		else
		{
			send_id = std::uint16_t(random(0xffff));
			recv_id = send_id - 1;
		}
		auto impl = std::make_unique<utp_socket_impl>(recv_id, send_id, str, *this);
		auto* const ret = impl.get();
		m_utp_sockets.emplace(recv_id, std::move(impl));
		return ret;
	}